

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfile_property.c
# Opt level: O0

int mpt_logfile_get(mpt_logfile *log,mpt_property *pr)

{
  char *__s1;
  int iVar1;
  long local_38;
  intptr_t id;
  intptr_t pos;
  char *name;
  mpt_property *pr_local;
  mpt_logfile *log_local;
  
  id = -1;
  if (pr == (mpt_property *)0x0) {
    return 4;
  }
  __s1 = pr->name;
  if (__s1 == (char *)0x0) {
    id = (intptr_t)pr->desc;
  }
  else if (*__s1 == '\0') {
    pr->name = "logfile";
    pr->desc = "log message target";
    (pr->val)._type = 4;
    *(FILE **)pr->_buf = log->file;
    (pr->val)._addr = pr->_buf;
    return (uint)(log->file != (FILE *)0x0);
  }
  local_38 = 0;
  if (__s1 == (char *)0x0) {
    local_38 = 1;
    if (id == 0) goto LAB_00123b77;
  }
  else {
    iVar1 = strcasecmp(__s1,"file");
    if (iVar1 == 0) {
LAB_00123b77:
      pr->name = "file";
      pr->desc = "output file descriptor";
      (pr->val)._type = 4;
      *(FILE **)pr->_buf = log->file;
      (pr->val)._addr = pr->_buf;
      return (uint)(log->file != (FILE *)0x0);
    }
  }
  if (__s1 == (char *)0x0) {
    if (id != local_38) {
      return -1;
    }
  }
  else {
    iVar1 = strcasecmp(__s1,"ignore");
    if (iVar1 != 0) {
      return -1;
    }
  }
  pr->name = "ignore";
  pr->desc = "output message filter";
  (pr->val)._type = 0x79;
  pr->_buf[0] = log->ignore;
  (pr->val)._addr = pr->_buf;
  return (uint)(log->ignore != '\b');
}

Assistant:

extern int mpt_logfile_get(const MPT_STRUCT(logfile) *log, MPT_STRUCT(property) *pr)
{
	const char *name;
	intptr_t pos = -1, id;
	
	if (!pr) {
		return MPT_ENUM(TypeFilePtr);
	}
	if (!(name = pr->name)) {
		pos = (intptr_t) pr->desc;
	}
	else if (!*name) {
		pr->name = "logfile";
		pr->desc = MPT_tr("log message target");
		MPT_property_set_data(pr, MPT_ENUM(TypeFilePtr), &log->file);
		return log->file ? 1 : 0;
	}
	id = 0;
	if (name ? (!strcasecmp(name, "file")) : pos == id++) {
		pr->name = "file";
		pr->desc = MPT_tr("output file descriptor");
		MPT_property_set_data(pr, MPT_ENUM(TypeFilePtr), &log->file);
		return log->file ? 1 : 0;
	}
	if (name ? !strcasecmp(name, "ignore") : pos == id++) {
		pr->name = "ignore";
		pr->desc = MPT_tr("output message filter");
		MPT_property_set_data(pr, 'y', &log->ignore);
		return log->ignore != MPT_LOG(Info) ? 1 : 0;
	}
	return MPT_ERROR(BadArgument);
}